

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ROIAlign_x86::forward
          (ROIAlign_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint _c;
  void *pvVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  int pw;
  long lVar14;
  int iVar15;
  int iVar16;
  _func_int *p_Var17;
  float *pfVar18;
  long lVar19;
  Mat *this_00;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined4 extraout_XMM0_Db;
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  allocator_type local_121;
  _func_int **local_120;
  ulong local_118;
  float local_10c;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e0;
  pointer local_d8;
  void *local_d0;
  ROIAlign_x86 *local_c8;
  float local_bc;
  int local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  Mat *local_98;
  _func_int **local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  
  local_d8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  iVar7 = local_d8->w;
  iVar16 = local_d8->h;
  _c = local_d8->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86[-3]),
              *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86[-3]),_c,local_d8->elemsize
              ,opt->blob_allocator);
  iVar5 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var17 = this->_vptr_ROIAlign_x86[-3];
    fVar22 = *(float *)(&this->field_0xd8 + (long)p_Var17);
    uVar1 = *local_d8[1].data;
    uVar2 = *(undefined8 *)((long)local_d8[1].data + 8);
    local_78._0_4_ = (float)uVar1 * fVar22;
    local_78._4_4_ = (float)((ulong)uVar1 >> 0x20) * fVar22;
    local_78._8_4_ = fVar22 * 0.0;
    local_78._12_4_ = fVar22 * 0.0;
    auVar27._0_4_ = (float)uVar2 * fVar22 - (float)local_78._0_4_;
    auVar27._4_4_ = (float)((ulong)uVar2 >> 0x20) * fVar22 - (float)local_78._4_4_;
    auVar27._8_4_ = fVar22 * 0.0 - local_78._8_4_;
    auVar27._12_4_ = fVar22 * 0.0 - local_78._12_4_;
    if ((&this->field_0xe0)[(long)p_Var17] == '\x01') {
      local_78._0_4_ = (float)local_78._0_4_ + -0.5;
      local_78._4_4_ = (float)local_78._4_4_ + -0.5;
      local_78._8_4_ = local_78._8_4_ + 0.0;
      local_78._12_4_ = local_78._12_4_ + 0.0;
    }
    else {
      auVar27 = maxps(auVar27,_DAT_004ed040);
    }
    lVar19 = *(long *)(&this->field_0xd0 + (long)p_Var17);
    iVar5 = (int)lVar19;
    iVar9 = (int)((ulong)lVar19 >> 0x20);
    auVar25._4_4_ = (float)iVar9;
    auVar25._0_4_ = (float)iVar5;
    auVar25._8_8_ = 0;
    auVar25 = rcpps(local_78,auVar25);
    local_a8 = auVar27._0_4_ * auVar25._0_4_;
    fStack_a4 = auVar27._4_4_ * auVar25._4_4_;
    fStack_a0 = auVar27._8_4_ * auVar25._8_4_;
    fStack_9c = auVar27._12_4_ * auVar25._12_4_;
    local_a8 = (auVar27._0_4_ - (float)iVar5 * local_a8) * auVar25._0_4_ + local_a8;
    fStack_a4 = (auVar27._4_4_ - (float)iVar9 * fStack_a4) * auVar25._4_4_ + fStack_a4;
    fStack_a0 = (auVar27._8_4_ - fStack_a0 * 0.0) * auVar25._8_4_ + fStack_a0;
    fStack_9c = (auVar27._12_4_ - fStack_9c * 0.0) * auVar25._12_4_ + fStack_9c;
    local_e0 = (ulong)_c;
    local_c8 = this;
    local_98 = this_00;
    if (*(int *)(&this->field_0xe4 + (long)p_Var17) == 1) {
      local_120 = (_func_int **)CONCAT44(local_120._4_4_,iVar16);
      if (*(int *)(&this->field_0xdc + (long)p_Var17) < 1) {
        uStack_f0 = 0;
        local_f8 = lVar19;
        fVar22 = ceilf(fStack_a4);
        local_108 = CONCAT44(local_108._4_4_,fVar22);
        fVar21 = ceilf(local_a8);
        iVar5 = (int)local_f8;
        iVar9 = local_f8._4_4_;
        fVar22 = (float)local_108;
      }
      else {
        fVar21 = (float)*(int *)(&this->field_0xdc + (long)p_Var17);
        fVar22 = fVar21;
      }
      iVar6 = (int)fVar22;
      iVar12 = (int)fVar21;
      iVar16 = 1;
      if (1 < iVar12 * iVar6) {
        iVar16 = iVar12 * iVar6;
      }
      local_108 = CONCAT44(local_108._4_4_,(float)iVar16);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)iVar9 * (long)iVar6 * (long)iVar5 * (long)iVar12,&local_121);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                ((int)local_120._0_4_,iVar7,
                 *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86[-3]),
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86[-3]),iVar6,iVar12,
                 (float)local_78._4_4_,(float)local_78._0_4_,fStack_a4,local_a8,iVar6,iVar12,
                 &pre_calc);
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      local_120 = this->_vptr_ROIAlign_x86;
      local_f8 = CONCAT44(local_f8._4_4_,iVar6 * iVar12);
      if ((int)_c < 1) {
        local_e0 = 0;
      }
      fVar22 = 1.0 / (float)local_108;
      uVar8 = 0;
      while (uVar10 = uVar8, uVar10 != local_e0) {
        lVar19 = local_d8->cstep * uVar10 * local_d8->elemsize;
        pvVar3 = local_d8->data;
        pvVar11 = (void *)(this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
        p_Var17 = local_120[-3];
        iVar16 = 0;
        for (iVar7 = 0; iVar7 < *(int *)(&this->field_0xd4 + (long)p_Var17); iVar7 = iVar7 + 1) {
          local_108 = CONCAT44(local_108._4_4_,iVar7);
          for (lVar14 = 0; lVar14 < *(int *)(&this->field_0xd0 + (long)p_Var17); lVar14 = lVar14 + 1
              ) {
            fVar21 = 0.0;
            iVar5 = iVar16;
            for (iVar9 = 0; iVar9 != iVar6; iVar9 = iVar9 + 1) {
              pfVar18 = &pre_calc.
                         super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar5].w1;
              iVar15 = iVar12;
              while (bVar20 = iVar15 != 0, iVar15 = iVar15 + -1, bVar20) {
                fVar21 = fVar21 + *(float *)((long)pvVar3 + (long)(int)pfVar18[-1] * 4 + lVar19) *
                                  pfVar18[3] +
                                  *(float *)((long)pvVar3 + (long)(int)pfVar18[-3] * 4 + lVar19) *
                                  pfVar18[1] +
                                  *(float *)((long)pvVar3 + (long)(int)pfVar18[-2] * 4 + lVar19) *
                                  pfVar18[2] +
                                  *(float *)((long)pvVar3 +
                                            (long)((PreCalc<float> *)(pfVar18 + -4))->pos1 * 4 +
                                            lVar19) * *pfVar18;
                pfVar18 = pfVar18 + 8;
              }
              iVar5 = iVar5 + iVar12;
            }
            iVar16 = iVar16 + iVar6 * iVar12;
            *(float *)((long)pvVar11 + lVar14 * 4) = fVar21 * fVar22;
            p_Var17 = local_120[-3];
            this = local_c8;
          }
          pvVar11 = (void *)((long)pvVar11 + (long)*(int *)(&this->field_0xd0 + (long)p_Var17) * 4);
          this = local_c8;
          this_00 = local_98;
        }
        local_118 = uVar10;
        uVar8 = uVar10 + 1;
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var17) != 0) {
        return 0;
      }
      local_88 = fStack_a4;
      fStack_84 = fStack_a4;
      fStack_80 = fStack_a4;
      fStack_7c = fStack_a4;
      if (*(int *)(&this->field_0xdc + (long)p_Var17) < 1) {
        uStack_f0 = 0;
        local_f8 = lVar19;
        fVar22 = ceilf(local_a8);
        local_108 = CONCAT44(extraout_XMM0_Db,fVar22);
        fVar21 = ceilf(local_88);
        fVar22 = (float)local_108;
        iVar5 = (int)local_f8;
        iVar9 = local_f8._4_4_;
      }
      else {
        fVar21 = (float)*(int *)(&this->field_0xdc + (long)p_Var17);
        fVar22 = fVar21;
      }
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)iVar9 * (long)(int)fVar21 * (long)iVar5 * (long)(int)fVar22,
                 &local_121);
      p_Var17 = this->_vptr_ROIAlign_x86[-3];
      uVar4 = local_78._4_4_;
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar16,iVar7,*(int *)(&this->field_0xd4 + (long)p_Var17),
                 *(int *)(&this->field_0xd0 + (long)p_Var17),(float)local_78._4_4_,
                 (float)local_78._0_4_,local_88,local_a8,*(int *)(&this->field_0xdc + (long)p_Var17)
                 ,&pre_calc);
      local_90 = this->_vptr_ROIAlign_x86;
      local_bc = (float)iVar16;
      local_10c = (float)iVar7;
      uVar8 = 0;
      fVar22 = local_88;
      if ((int)_c < 1) {
        local_e0 = uVar8;
      }
      for (; uVar8 != local_e0; uVar8 = uVar8 + 1) {
        lVar19 = local_d8->cstep * uVar8 * local_d8->elemsize;
        pvVar11 = local_d8->data;
        local_d0 = (void *)(this_00->cstep * uVar8 * this_00->elemsize + (long)this_00->data);
        p_Var17 = local_90[-3];
        iVar16 = 0;
        iVar7 = 0;
        while (iVar7 < *(int *)(&this->field_0xd4 + (long)p_Var17)) {
          local_ac = (float)iVar7 * fVar22 + (float)uVar4;
          local_b8 = iVar7 + 1;
          local_b0 = (float)local_b8 * fVar22 + (float)uVar4;
          if (local_ac <= 0.0) {
            local_ac = 0.0;
          }
          if (local_bc <= local_ac) {
            local_ac = local_bc;
          }
          if (local_b0 <= 0.0) {
            local_b0 = 0.0;
          }
          if (local_bc <= local_b0) {
            local_b0 = local_bc;
          }
          local_b4 = ceilf(local_b0 - local_ac);
          lVar14 = 0;
          fVar22 = local_a8;
          fVar21 = (float)local_78._0_4_;
          fVar29 = local_10c;
          while( true ) {
            if (*(int *)(&this->field_0xd0 + (long)p_Var17) <= lVar14) break;
            fVar26 = (float)(int)lVar14 * fVar22 + fVar21;
            local_108 = lVar14 + 1;
            fVar28 = (float)(int)local_108 * fVar22 + fVar21;
            if (fVar26 <= 0.0) {
              fVar26 = 0.0;
            }
            if (fVar29 <= fVar26) {
              fVar26 = fVar29;
            }
            if (fVar28 <= 0.0) {
              fVar28 = 0.0;
            }
            if (fVar29 <= fVar28) {
              fVar28 = fVar29;
            }
            local_f8 = lVar14;
            if (*(int *)(&this->field_0xdc + (long)p_Var17) < 1) {
              local_120 = (_func_int **)CONCAT44(local_120._4_4_,fVar26);
              local_118 = CONCAT44(local_118._4_4_,fVar28);
              fVar24 = ceilf(fVar28 - fVar26);
              fVar28 = (float)local_118;
              fVar22 = local_a8;
              fVar21 = (float)local_78._0_4_;
              fVar29 = local_10c;
              fVar23 = local_b4;
              fVar26 = local_120._0_4_;
            }
            else {
              fVar24 = (float)*(int *)(&this->field_0xdc + (long)p_Var17);
              fVar23 = fVar24;
            }
            iVar5 = (int)fVar23;
            iVar9 = (int)fVar24;
            iVar12 = 0;
            iVar7 = 0;
            if (0 < iVar9) {
              iVar7 = iVar9;
            }
            local_118 = CONCAT44(local_118._4_4_,iVar5);
            iVar6 = 0;
            if (0 < iVar5) {
              iVar6 = iVar5;
            }
            fVar23 = 0.0;
            local_120 = (_func_int **)CONCAT44(local_120._4_4_,iVar16);
            iVar15 = iVar16;
            for (; iVar12 != iVar6; iVar12 = iVar12 + 1) {
              pfVar18 = &pre_calc.
                         super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar15].w1;
              iVar13 = iVar7;
              while (bVar20 = iVar13 != 0, iVar13 = iVar13 + -1, bVar20) {
                fVar23 = fVar23 + *(float *)((long)pvVar11 + (long)(int)pfVar18[-1] * 4 + lVar19) *
                                  pfVar18[3] +
                                  *(float *)((long)pvVar11 + (long)(int)pfVar18[-3] * 4 + lVar19) *
                                  pfVar18[1] +
                                  *(float *)((long)pvVar11 + (long)(int)pfVar18[-2] * 4 + lVar19) *
                                  pfVar18[2] +
                                  *(float *)((long)pvVar11 +
                                            (long)((PreCalc<float> *)(pfVar18 + -4))->pos1 * 4 +
                                            lVar19) * *pfVar18;
                pfVar18 = pfVar18 + 8;
              }
              iVar15 = iVar15 + iVar7;
            }
            fVar24 = 0.0;
            if (fVar26 < fVar28 && local_ac < local_b0) {
              fVar24 = fVar23 / (float)(iVar9 * iVar5);
            }
            iVar16 = iVar16 + iVar6 * iVar7;
            *(float *)((long)local_d0 + local_f8 * 4) = fVar24;
            p_Var17 = local_90[-3];
            lVar14 = local_108;
            this = local_c8;
          }
          local_d0 = (void *)((long)local_d0 + (long)*(int *)(&this->field_0xd0 + (long)p_Var17) * 4
                             );
          fVar22 = local_88;
          iVar7 = local_b8;
        }
        this_00 = local_98;
      }
    }
    std::_Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::~_Vector_base
              (&pre_calc.
                super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int ROIAlign_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}